

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

void * sk_getxdmdata(Socket *sock,int *lenp)

{
  uint uVar1;
  undefined1 uVar2;
  int iVar3;
  __pid_t _Var4;
  char *pcVar5;
  undefined1 *puVar6;
  uint8_t *p;
  socklen_t addrlen;
  sockaddr_union u;
  socklen_t local_8c;
  sockaddr local_88;
  int local_78;
  char local_74 [108];
  
  if (sock->vt == &NetSocket_sockvt) {
    local_8c = 0x80;
    iVar3 = getsockname(*(int *)&sock[-0x11].vt,&local_88,&local_8c);
    if (-1 < iVar3) {
      if (local_88.sa_family == 1) {
        *lenp = 6;
        puVar6 = (undefined1 *)safemalloc(6,1,0);
        uVar1 = sk_getxdmdata::unix_addr;
        uVar2 = (undefined1)sk_getxdmdata::unix_addr;
        sk_getxdmdata::unix_addr = sk_getxdmdata::unix_addr - 1;
        puVar6[3] = uVar2;
        puVar6[2] = (char)(uVar1 >> 8);
        puVar6[1] = (char)(uVar1 >> 0x10);
        *puVar6 = (char)(uVar1 >> 0x18);
        _Var4 = getpid();
        *(ushort *)(puVar6 + 4) = (ushort)_Var4 << 8 | (ushort)_Var4 >> 8;
        return puVar6;
      }
      if (local_88.sa_family == 10) {
        *lenp = 6;
        pcVar5 = (char *)safemalloc(6,1,0);
        if (((local_88.sa_data._6_4_ != 0) || (local_88.sa_data._10_4_ != 0)) ||
           (local_88.sa_data._2_4_ = local_74._0_4_, local_78 != -0x10000)) {
          pcVar5[4] = '\0';
          pcVar5[5] = '\0';
          pcVar5[0] = '\0';
          pcVar5[1] = '\0';
          pcVar5[2] = '\0';
          pcVar5[3] = '\0';
          return pcVar5;
        }
      }
      else {
        if (local_88.sa_family != 2) {
          return (void *)0x0;
        }
        *lenp = 6;
        pcVar5 = (char *)safemalloc(6,1,0);
      }
      *(undefined4 *)pcVar5 = local_88.sa_data._2_4_;
      *(undefined2 *)(pcVar5 + 4) = local_88.sa_data._0_2_;
      return pcVar5;
    }
  }
  return (void *)0x0;
}

Assistant:

void *sk_getxdmdata(Socket *sock, int *lenp)
{
    NetSocket *s;
    union sockaddr_union u;
    socklen_t addrlen;
    char *buf;
    static unsigned int unix_addr = 0xFFFFFFFF;

    /*
     * We must check that this socket really _is_ a NetSocket before
     * downcasting it.
     */
    if (sock->vt != &NetSocket_sockvt)
        return NULL;                   /* failure */
    s = container_of(sock, NetSocket, sock);

    addrlen = sizeof(u);
    if (getsockname(s->s, &u.sa, &addrlen) < 0)
        return NULL;
    switch(u.sa.sa_family) {
      case AF_INET:
        *lenp = 6;
        buf = snewn(*lenp, char);
        PUT_32BIT_MSB_FIRST(buf, ntohl(u.sin.sin_addr.s_addr));
        PUT_16BIT_MSB_FIRST(buf+4, ntohs(u.sin.sin_port));
        break;
#ifndef NO_IPV6
    case AF_INET6:
        *lenp = 6;
        buf = snewn(*lenp, char);
        if (IN6_IS_ADDR_V4MAPPED(&u.sin6.sin6_addr)) {
            memcpy(buf, u.sin6.sin6_addr.s6_addr + 12, 4);
            PUT_16BIT_MSB_FIRST(buf+4, ntohs(u.sin6.sin6_port));
        } else
            /* This is stupid, but it's what XLib does. */
            memset(buf, 0, 6);
        break;
#endif
      case AF_UNIX:
        *lenp = 6;
        buf = snewn(*lenp, char);
        PUT_32BIT_MSB_FIRST(buf, unix_addr--);
        PUT_16BIT_MSB_FIRST(buf+4, getpid());
        break;

        /* XXX IPV6 */

      default:
        return NULL;
    }

    return buf;
}